

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O3

void __thiscall
qclab::qgates::RotationY<std::complex<double>_>::RotationY
          (RotationY<std::complex<double>_> *this,real_type theta)

{
  double dVar1;
  
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.qubit_ = 0
  ;
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.field_0xc
       = 0;
  dVar1 = ::cos(theta * 0.5);
  (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ = dVar1;
  dVar1 = ::sin(theta * 0.5);
  (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_ = dVar1;
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139a80;
  return;
}

Assistant:

RotationY( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }